

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

int predict_skip_txfm(MACROBLOCK *x,BLOCK_SIZE bsize,int64_t *dist,int reduced_tx_set)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  MB_MODE_INFO *pMVar6;
  int16_t iVar7;
  int16_t iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int16_t *piVar16;
  undefined7 in_register_00000031;
  int col;
  uint uVar17;
  uint uVar18;
  TxfmParam param;
  tran_low_t coefs [1024];
  TxfmParam local_1078;
  int local_1060 [1036];
  
  uVar11 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  bVar1 = block_size_wide[uVar11];
  bVar2 = block_size_high[uVar11];
  iVar7 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
  lVar10 = av1_pixel_diff_dist(x,0,0,0,bsize,bsize,(uint *)0x0);
  *dist = lVar10;
  lVar13 = (long)(short)((uint)(int)iVar7 >> 3);
  uVar14 = (ulong)(lVar13 * lVar13) >> 3;
  uVar17 = (x->txfm_search_params).skip_txfm_level;
  if (uVar17 < 2) {
    lVar10 = (lVar10 / (long)(ulong)bVar1) / (long)(ulong)bVar2;
  }
  uVar18 = (uint)(lVar10 <= (long)uVar14);
  if ((uVar17 < 2) && (lVar10 <= (long)uVar14)) {
    local_1078.tx_size = ""[uVar11];
    uVar14 = (ulong)local_1078.tx_size;
    iVar3 = tx_size_high[local_1078.tx_size];
    iVar4 = tx_size_wide[local_1078.tx_size];
    local_1078.tx_type = '\0';
    local_1078.bd = (x->e_mbd).bd;
    local_1078.is_hbd = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
    local_1078.lossless = 0;
    pMVar6 = *(x->e_mbd).mi;
    uVar17 = 1;
    if ((pMVar6->field_0xa7 & 0x80) == 0) {
      uVar17 = (uint)('\0' < pMVar6->ref_frame[0]);
    }
    iVar9 = 0;
    uVar18 = 0;
    if (((0x61810UL >> (uVar14 & 0x3f) & 1) == 0) &&
       (uVar18 = uVar17, (0x18608UL >> (uVar14 & 0x3f) & 1) == 0)) {
      if (reduced_tx_set == 0) {
        uVar18 = (uint)av1_ext_tx_set_lookup[0]
                       [(ulong)((0x60604UL >> (uVar14 & 0x3f) & 1) != 0) + (ulong)(uVar17 * 2)];
      }
      else {
        uVar18 = (uint)(byte)((uVar17 == 0) + 1);
      }
    }
    local_1078.tx_set_type = (TxSetType)uVar18;
    lVar10 = 0;
    if (local_1078.bd != AOM_BITS_8) {
      lVar10 = (ulong)(local_1078.bd != AOM_BITS_10) + 1;
    }
    uVar5 = skip_pred_threshold[lVar10][uVar11];
    piVar16 = x->plane[0].src_diff;
    uVar17 = iVar4 * iVar3;
    iVar8 = av1_ac_quant_QTX(x->qindex,0,local_1078.bd);
    uVar18 = 0;
    do {
      lVar10 = 0;
      do {
        av1_fwd_txfm(piVar16 + lVar10,local_1060,(uint)bVar1,&local_1078);
        iVar12 = -local_1060[0];
        if (0 < local_1060[0]) {
          iVar12 = local_1060[0];
        }
        if ((int)iVar7 * uVar5 <= (uint)(iVar12 << 7)) {
          return uVar18;
        }
        if (1 < (int)uVar17) {
          uVar11 = 1;
          do {
            iVar12 = local_1060[uVar11];
            iVar15 = -iVar12;
            if (0 < iVar12) {
              iVar15 = iVar12;
            }
            if ((int)iVar8 * uVar5 <= (uint)(iVar15 << 7)) {
              return uVar18;
            }
            uVar11 = uVar11 + 1;
          } while (uVar17 != uVar11);
        }
        lVar10 = lVar10 + iVar4;
      } while (lVar10 < (long)(ulong)(uint)bVar1);
      piVar16 = piVar16 + (ulong)bVar1 * (long)iVar3;
      iVar9 = iVar9 + iVar3;
      uVar18 = (uint)((int)(uint)bVar2 <= iVar9);
    } while (iVar9 < (int)(uint)bVar2);
  }
  return uVar18;
}

Assistant:

static int predict_skip_txfm(MACROBLOCK *x, BLOCK_SIZE bsize, int64_t *dist,
                             int reduced_tx_set) {
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const MACROBLOCKD *xd = &x->e_mbd;
  const int16_t dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd);

  *dist = av1_pixel_diff_dist(x, 0, 0, 0, bsize, bsize, NULL);

  const int64_t mse = *dist / bw / bh;
  // Normalized quantizer takes the transform upscaling factor (8 for tx size
  // smaller than 32) into account.
  const int16_t normalized_dc_q = dc_q >> 3;
  const int64_t mse_thresh = (int64_t)normalized_dc_q * normalized_dc_q / 8;
  // For faster early skip decision, use dist to compare against threshold so
  // that quality risk is less for the skip=1 decision. Otherwise, use mse
  // since the fwd_txfm coeff checks will take care of quality
  // TODO(any): Use dist to return 0 when skip_txfm_level is 1
  int64_t pred_err = (txfm_params->skip_txfm_level >= 2) ? *dist : mse;
  // Predict not to skip when error is larger than threshold.
  if (pred_err > mse_thresh) return 0;
  // Return as skip otherwise for aggressive early skip
  else if (txfm_params->skip_txfm_level >= 2)
    return 1;

  const int max_tx_size = max_predict_sf_tx_size[bsize];
  const int tx_h = tx_size_high[max_tx_size];
  const int tx_w = tx_size_wide[max_tx_size];
  DECLARE_ALIGNED(32, tran_low_t, coefs[32 * 32]);
  TxfmParam param;
  param.tx_type = DCT_DCT;
  param.tx_size = max_tx_size;
  param.bd = xd->bd;
  param.is_hbd = is_cur_buf_hbd(xd);
  param.lossless = 0;
  param.tx_set_type = av1_get_ext_tx_set_type(
      param.tx_size, is_inter_block(xd->mi[0]), reduced_tx_set);
  const int bd_idx = (xd->bd == 8) ? 0 : ((xd->bd == 10) ? 1 : 2);
  const uint32_t max_qcoef_thresh = skip_pred_threshold[bd_idx][bsize];
  const int16_t *src_diff = x->plane[0].src_diff;
  const int n_coeff = tx_w * tx_h;
  const int16_t ac_q = av1_ac_quant_QTX(x->qindex, 0, xd->bd);
  const uint32_t dc_thresh = max_qcoef_thresh * dc_q;
  const uint32_t ac_thresh = max_qcoef_thresh * ac_q;
  for (int row = 0; row < bh; row += tx_h) {
    for (int col = 0; col < bw; col += tx_w) {
      av1_fwd_txfm(src_diff + col, coefs, bw, &param);
      // Operating on TX domain, not pixels; we want the QTX quantizers
      const uint32_t dc_coef = (((uint32_t)abs(coefs[0])) << 7);
      if (dc_coef >= dc_thresh) return 0;
      for (int i = 1; i < n_coeff; ++i) {
        const uint32_t ac_coef = (((uint32_t)abs(coefs[i])) << 7);
        if (ac_coef >= ac_thresh) return 0;
      }
    }
    src_diff += tx_h * bw;
  }
  return 1;
}